

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512.cpp
# Opt level: O3

int ncnn::gemm_x86(Mat *A,Mat *B,Mat *C,Mat *top_blob,int broadcast_type_C,int transA,int transB,
                  int output_transpose,int constant_TILE_M,int constant_TILE_N,int constant_TILE_K,
                  int nT,Option *opt)

{
  int max_kk;
  int *piVar1;
  ulong uVar2;
  long lVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int max_jj;
  int iVar8;
  long lVar9;
  Mat *pMVar10;
  int iVar11;
  uint max_kk_00;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int k;
  int j;
  int iVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int local_204;
  int TILE_K;
  Mat *local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  uint local_19c;
  int TILE_N;
  int TILE_M;
  Mat *local_190;
  long local_188;
  long local_180;
  Mat *local_178;
  Mat *local_170;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  if (transA == 0) {
    iVar6 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
    iVar16 = A->w;
  }
  else {
    iVar6 = A->w;
    iVar16 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
  }
  if (transB == 0) {
    uVar18 = B->w;
  }
  else {
    uVar18 = B->elempack * (&B->h)[(ulong)(B->dims == 3) * 2];
  }
  local_190 = C;
  local_178 = top_blob;
  get_optimal_tile_mnk
            (iVar6,uVar18,iVar16,constant_TILE_M,constant_TILE_N,constant_TILE_K,&TILE_M,&TILE_N,
             &TILE_K,nT);
  iVar7 = TILE_M;
  iVar15 = TILE_N;
  iVar8 = TILE_K;
  uVar5 = (iVar6 + TILE_M + -1) / TILE_M;
  iVar6 = (int)(uVar18 + TILE_N + -1) / TILE_N;
  iVar19 = (TILE_K + iVar16 + -1) / TILE_K;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  local_1b8 = (ulong)uVar18;
  Mat::create(&local_78,TILE_K * TILE_M,iVar19,nT,4,opt->workspace_allocator);
  iVar11 = -100;
  if ((local_78.data == (void *)0x0) || ((long)local_78.c * local_78.cstep == 0)) goto LAB_004d913f;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,iVar8 * iVar15,iVar19,iVar6,4,opt->workspace_allocator);
  iVar11 = -100;
  if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
    iVar6 = iVar19 * iVar6;
    if (0 < iVar6) {
      iVar11 = 0;
      do {
        j = iVar15 * (iVar11 / iVar19);
        k = iVar8 * (int)((long)iVar11 % (long)iVar19);
        max_jj = (int)local_1b8 - j;
        if (iVar15 < max_jj) {
          max_jj = iVar15;
        }
        max_kk = iVar16 - k;
        if (iVar8 < iVar16 - k) {
          max_kk = iVar8;
        }
        pMVar10 = (Mat *)((long)local_c8.data +
                         ((long)iVar11 % (long)iVar19 & 0xffffffffU) * (long)local_c8.w *
                         CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) +
                         (long)(iVar11 / iVar19) * local_c8.cstep *
                         CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
        if (transB == 0) {
          transpose_pack_B_tile(B,pMVar10,j,max_jj,k,max_kk);
        }
        else {
          pack_B_tile(B,pMVar10,j,max_jj,k,max_kk);
        }
        iVar11 = iVar11 + 1;
      } while (iVar6 != iVar11);
    }
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    if (((output_transpose == 0) && (broadcast_type_C != 3)) && (iVar16 <= iVar8)) {
LAB_004d8c75:
      if (0 < (int)uVar5) {
        local_1c0 = 0;
        uVar12 = local_1b8;
        do {
          iVar6 = TILE_K;
          if (transA == 0) {
            iVar16 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
            local_204 = A->w;
          }
          else {
            iVar16 = A->w;
            local_204 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
          }
          iVar8 = TILE_M * (int)local_1c0;
          uVar18 = iVar16 - iVar8;
          if (TILE_M < iVar16 - iVar8) {
            uVar18 = TILE_M;
          }
          uVar17 = (ulong)uVar18;
          local_118.cstep = 0;
          local_118.data = (Mat *)0x0;
          local_118.refcount._0_4_ = 0;
          local_118.refcount._4_4_ = 0;
          local_118.elemsize._0_4_ = 0;
          local_118.elemsize._4_4_ = 0;
          local_118.elempack = 0;
          local_118.h = 0;
          local_118.d = 0;
          local_118.c = 0;
          local_118.allocator = (Allocator *)0x0;
          local_118.dims = 0;
          local_118.w = 0;
          if (((output_transpose != 0) || (broadcast_type_C == 3)) || (TILE_K < local_204)) {
            iVar16 = get_omp_thread_num();
            uVar2 = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
            local_118.cstep =
                 (uVar2 * (long)local_168.h * (long)local_168.w + 0xf & 0xfffffffffffffff0) / uVar2;
            if (local_168.dims == 4) {
              local_118.cstep = (long)local_168.h * (long)local_168.w;
            }
            local_118.dims = local_168.dims + -1;
            local_118.data = (void *)((long)iVar16 * local_168.cstep * uVar2 + (long)local_168.data)
            ;
            local_118.elemsize._0_4_ = (undefined4)local_168.elemsize;
            local_118.elemsize._4_4_ = local_168.elemsize._4_4_;
            local_118.elempack = local_168.elempack;
            local_118.allocator = local_168.allocator;
            local_118.w = local_168.w;
            local_118.h = local_168.h;
            local_118.c = local_168.d;
            local_118.d = 1;
          }
          local_118.refcount._4_4_ = 0;
          local_118.refcount._0_4_ = 0;
          local_1c8 = (Mat *)local_118.data;
          if (0 < (int)uVar12) {
            iVar16 = 0;
            local_19c = TILE_N;
            uVar18 = TILE_N;
            local_1a8 = uVar17;
            do {
              max_kk_00 = (int)uVar12 - iVar16;
              if ((int)uVar18 < (int)max_kk_00) {
                max_kk_00 = uVar18;
              }
              local_1b0 = (ulong)max_kk_00;
              local_170 = local_190;
              if (broadcast_type_C == 3) {
                pack_A_tile(local_190,local_1c8,iVar8,(int)uVar17,iVar16,max_kk_00);
                local_170 = &local_118;
              }
              if (0 < local_204) {
                iVar15 = local_204;
                iVar7 = 0;
                do {
                  iVar11 = iVar15;
                  if (iVar6 < iVar15) {
                    iVar11 = iVar6;
                  }
                  iVar19 = get_omp_thread_num();
                  pvVar4 = local_c8.data;
                  lVar14 = (long)(iVar7 / iVar6);
                  pMVar10 = (Mat *)((long)local_78.data +
                                   (long)local_78.w *
                                   CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                                   lVar14 + (long)iVar19 * local_78.cstep *
                                            CONCAT44(local_78.elemsize._4_4_,
                                                     (undefined4)local_78.elemsize));
                  lVar9 = (long)local_c8.w;
                  lVar13 = (long)(iVar16 / (int)uVar18) * local_c8.cstep;
                  lVar3 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
                  if (iVar16 == 0) {
                    local_188 = lVar9;
                    local_180 = lVar14;
                    if (transA == 0) {
                      pack_A_tile(A,pMVar10,iVar8,(int)local_1a8,iVar7,iVar11);
                      lVar9 = local_188;
                      lVar14 = local_180;
                    }
                    else {
                      transpose_pack_A_tile(A,pMVar10,iVar8,(int)local_1a8,iVar7,iVar11);
                      lVar9 = local_188;
                      lVar14 = local_180;
                    }
                  }
                  uVar17 = local_1a8;
                  iVar19 = iVar6 + iVar7;
                  gemm_transB_packed_tile
                            (pMVar10,(Mat *)((long)pvVar4 + lVar3 * lVar9 * lVar14 + lVar13 * lVar3)
                             ,local_170,local_1c8,local_178,broadcast_type_C,iVar8,(int)local_1a8,
                             iVar16,(int)local_1b0,iVar7,iVar11,
                             local_204 <= iVar19 && output_transpose == 0);
                  iVar15 = iVar15 - iVar6;
                  uVar18 = local_19c;
                  iVar7 = iVar19;
                } while (iVar19 < local_204);
              }
              if (output_transpose != 0) {
                transpose_unpack_output_tile
                          (local_1c8,local_178,iVar8,(int)uVar17,iVar16,(int)local_1b0);
              }
              uVar12 = local_1b8;
              iVar16 = iVar16 + uVar18;
            } while (iVar16 < (int)local_1b8);
            piVar1 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (local_118.allocator == (Allocator *)0x0) {
                  if ((Mat *)local_118.data != (Mat *)0x0) {
                    free(local_118.data);
                  }
                }
                else {
                  (*(local_118.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          uVar18 = (int)local_1c0 + 1;
          local_1c0 = (ulong)uVar18;
        } while (uVar18 != uVar5);
      }
      iVar11 = 0;
    }
    else {
      Mat::create(&local_168,iVar7 * iVar15,1,nT,4,opt->workspace_allocator);
      iVar11 = -100;
      if ((local_168.data != (void *)0x0) && ((long)local_168.c * local_168.cstep != 0))
      goto LAB_004d8c75;
    }
    piVar1 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_004d913f:
  piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar11;
}

Assistant:

static int gemm_x86(const Mat& A, const Mat& B, const Mat& C, Mat& top_blob, int broadcast_type_C, int transA, int transB, int output_transpose, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
    const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;
    const int N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    int nn_N = (N + TILE_N - 1) / TILE_N;
    int nn_K = (K + TILE_K - 1) / TILE_K;

    Mat ATX(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, nT, 4u, opt.workspace_allocator);
    if (ATX.empty())
        return -100;
    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    // pack B
    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        if (transB)
        {
            pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
        else
        {
            transpose_pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
    }

    Mat topT;
    if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
    {
        topT.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
        if (topT.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        const int i = ppi * TILE_M;

        // shadowed variable for less openmp task args
        const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile;
        if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
            topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            if (broadcast_type_C == 3)
            {
                pack_A_tile(C, topT_tile, i, max_ii, j, max_jj);
            }

            const Mat& CT_tile = broadcast_type_C == 3 ? topT_tile : C;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = ATX.channel(get_omp_thread_num()).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (j == 0)
                {
                    if (transA)
                    {
                        transpose_pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                    else
                    {
                        pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                }

                bool k_end = !output_transpose && k + TILE_K >= K;

                gemm_transB_packed_tile(AT_tile, BT_tile, CT_tile, topT_tile, top_blob, broadcast_type_C, i, max_ii, j, max_jj, k, max_kk, k_end);
            }

            if (output_transpose)
            {
                transpose_unpack_output_tile(topT_tile, top_blob, i, max_ii, j, max_jj);
            }
        }
    }

    return 0;
}